

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int JS_ToInt64(JSContext *ctx,int64_t *pres,JSValue val)

{
  JSRefCountHeader *p;
  JSValueUnion JVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  
  if (0xfffffff4 < (uint)val.tag) {
    *(int *)val.u.ptr = *val.u.ptr + 1;
  }
  iVar5 = -1;
  lVar4 = 0;
  while( true ) {
    JVar1 = val.u;
    if ((uint)val.tag < 4) break;
    if ((uint)val.tag == 7) {
      uVar2 = val.u._4_4_ >> 0x14 & 0x7ff;
      if (uVar2 < 0x43e) {
        lVar4 = (long)JVar1.float64;
        goto LAB_0011d92d;
      }
      iVar5 = 0;
      if (uVar2 < 0x473) {
        lVar3 = ((ulong)JVar1.ptr & 0xfffffffffffff) + 0x10000000000000 <<
                ((char)uVar2 - 0x33U & 0x3f);
        lVar4 = -lVar3;
        if (-1 < (long)JVar1.ptr) {
          lVar4 = lVar3;
        }
      }
      else {
        lVar4 = 0;
      }
      goto LAB_0011d930;
    }
    val = JS_ToNumberFree(ctx,val);
    if ((int)val.tag == 6) goto LAB_0011d930;
  }
  lVar4 = (long)val.u._0_4_;
LAB_0011d92d:
  iVar5 = 0;
LAB_0011d930:
  *pres = lVar4;
  return iVar5;
}

Assistant:

int JS_ToInt64(JSContext *ctx, int64_t *pres, JSValueConst val)
{
    return JS_ToInt64Free(ctx, pres, JS_DupValue(ctx, val));
}